

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnStructType
          (BinaryReaderIR *this,Index index,Index field_count,TypeMut *fields)

{
  anon_struct_3_3_4b311855_for_features_used *paVar1;
  bool *pbVar2;
  Module *pMVar3;
  long *plVar4;
  undefined8 uVar5;
  long lVar6;
  pointer *__ptr;
  undefined1 local_58 [48];
  
  GetLocation((Location *)(local_58 + 0x10),this);
  std::make_unique<wabt::TypeModuleField,wabt::Location>((Location *)local_58);
  std::make_unique<wabt::StructType>();
  std::vector<wabt::Field,_std::allocator<wabt::Field>_>::resize
            ((vector<wabt::Field,_std::allocator<wabt::Field>_> *)(local_58._16_8_ + 0x50),
             (ulong)field_count);
  uVar5 = local_58._16_8_;
  for (lVar6 = 0; (ulong)field_count * 0xc - lVar6 != 0; lVar6 = lVar6 + 0xc) {
    *(undefined8 *)(*(long *)(local_58._16_8_ + 0x50) + 0x20 + lVar6 * 4) =
         *(undefined8 *)((long)&(fields->type).enum_ + lVar6);
    *(bool *)(*(long *)(local_58._16_8_ + 0x50) + 0x28 + lVar6 * 4) = (&fields->mutable_)[lVar6];
    pMVar3 = this->module_;
    paVar1 = &pMVar3->features_used;
    paVar1->simd = (bool)(paVar1->simd | *(int *)((long)&(fields->type).enum_ + lVar6) == -5);
    pbVar2 = &(pMVar3->features_used).exceptions;
    *pbVar2 = (bool)(*pbVar2 | *(int *)((long)&(fields->type).enum_ + lVar6) == -0x17);
  }
  local_58._16_8_ = 0;
  plVar4 = *(long **)(local_58._0_8_ + 0x40);
  ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)(local_58._0_8_ + 0x40)
  )->offset = uVar5;
  local_58._8_8_ = local_58._0_8_;
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 8))();
    local_58._8_8_ = local_58._0_8_;
  }
  local_58._0_8_ = (long *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                       *)(local_58 + 8));
  if ((long *)local_58._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_58._8_8_ + 8))();
  }
  local_58._8_8_ = (char *)0x0;
  if (local_58._16_8_ != 0) {
    (**(code **)(*(long *)local_58._16_8_ + 8))();
  }
  if ((long *)local_58._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_58._0_8_ + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnStructType(Index index,
                                    Index field_count,
                                    TypeMut* fields) {
  auto field = std::make_unique<TypeModuleField>(GetLocation());
  auto struct_type = std::make_unique<StructType>();
  struct_type->fields.resize(field_count);
  for (Index i = 0; i < field_count; ++i) {
    struct_type->fields[i].type = fields[i].type;
    struct_type->fields[i].mutable_ = fields[i].mutable_;
    module_->features_used.simd |= (fields[i].type == Type::V128);
    module_->features_used.exceptions |= (fields[i].type == Type::ExnRef);
  }
  field->type = std::move(struct_type);
  module_->AppendField(std::move(field));
  return Result::Ok;
}